

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O1

void __thiscall
banksia::UciEngine::parseLine(UciEngine *this,int cmdInt,string *cmdString,string *line)

{
  EngineComputingState __args_4;
  GameTimeController *this_00;
  bool bVar1;
  int iVar2;
  uint *__n;
  void *__buf;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
  moveRecv;
  value_type moveString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string ponderMoveString;
  _Any_data local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  double local_78;
  Move local_70;
  string local_60;
  Move local_40;
  
  if (-1 < cmdInt) {
    __n = &switchD_00168e0a::switchdataD_0018c4dc;
    switch(cmdInt) {
    case 0:
      Player::setState((Player *)this,ready);
      this->expectingBestmove = false;
      (*(this->super_EngineProfile).super_Engine.super_Player.super_Obj._vptr_Obj[0x24])(this);
      (*(this->super_EngineProfile).super_Engine.super_Player.super_Obj._vptr_Obj[0x1f])(this);
      return;
    case 2:
      bVar1 = parseOption(this,line);
      if (!bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_d0,"Unknown option ",line);
        Engine::write((Engine *)this,(int)&local_d0,__buf,(size_t)__n);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_unused._0_8_ != &local_c0) {
          operator_delete(local_d0._M_unused._M_object);
        }
      }
      break;
    case 3:
      if ((this->super_EngineProfile).super_Engine.computingState == thinking) {
        parseInfo(this,line);
        return;
      }
      break;
    case 4:
      this_00 = (this->super_EngineProfile).super_Engine.super_Player.timeController;
      std::
      function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
      ::function((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                  *)&local_d0,&(this->super_EngineProfile).super_Engine.super_Player.moveReceiver);
      if ((this_00 == (GameTimeController *)0x0) ||
         (CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) == 0)) {
        if ((code *)CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) !=
            (code *)0x0) {
          (*(code *)CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]))
                    (&local_d0,&local_d0,3);
        }
      }
      else {
        this->expectingBestmove = false;
        __args_4 = (this->super_EngineProfile).super_Engine.computingState;
        (this->super_EngineProfile).super_Engine.computingState = idle;
        local_78 = GameTimeController::moveTimeConsumed(this_00);
        splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_90,line,' ');
        if (0x20 < (ulong)(local_90._8_8_ - local_90._0_8_)) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,*(long *)(local_90._M_allocated_capacity + 0x20),
                     *(long *)(local_90._M_allocated_capacity + 0x28) +
                     *(long *)(local_90._M_allocated_capacity + 0x20));
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
          if ((0x60 < (ulong)(local_90._8_8_ - local_90._0_8_)) &&
             (iVar2 = std::__cxx11::string::compare((char *)(local_90._M_allocated_capacity + 0x40))
             , iVar2 == 0)) {
            if ((ulong)((long)(local_90._8_8_ - local_90._0_8_) >> 5) < 4) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,3);
            }
            std::__cxx11::string::_M_assign((string *)&local_60);
          }
          if ((local_b0._M_string_length != 0) &&
             ((this->super_EngineProfile).super_Engine.super_Player.moveReceiver.
              super__Function_base._M_manager != (_Manager_type)0x0)) {
            local_70 = BoardCore::moveFromCoordiateString(&local_b0);
            local_40 = BoardCore::moveFromCoordiateString(&local_60);
            std::
            function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
            ::operator()((function<void_(const_banksia::Move_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_banksia::Move_&,_double,_banksia::EngineComputingState)>
                          *)&local_d0,&local_70,&local_b0,&local_40,local_78,__args_4);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_90);
        if ((code *)CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) !=
            (code *)0x0) {
          (*(code *)CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]))
                    (&local_d0,&local_d0,3);
        }
      }
      break;
    case 5:
      splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b0,line,' ');
      if (0x40 < local_b0._M_string_length - (long)local_b0._M_dataplus._M_p) {
        local_d0._8_8_ = 0;
        local_c0._M_local_buf[0] = '\0';
        uVar3 = (long)(local_b0._M_string_length - (long)local_b0._M_dataplus._M_p) >> 5;
        local_d0._M_unused._M_object = &local_c0;
        if (2 < uVar3) {
          uVar5 = 2;
          lVar4 = 0x48;
          do {
            if (local_d0._8_8_ != 0) {
              std::__cxx11::string::append(local_d0._M_pod_data);
            }
            if ((ulong)((long)(local_b0._M_string_length - (long)local_b0._M_dataplus._M_p) >> 5) <=
                uVar5) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar5);
            }
            std::__cxx11::string::_M_append
                      (local_d0._M_pod_data,*(ulong *)(local_b0._M_dataplus._M_p + lVar4 + -8));
            uVar5 = uVar5 + 1;
            uVar3 = (long)(local_b0._M_string_length - (long)local_b0._M_dataplus._M_p) >> 5;
            lVar4 = lVar4 + 0x20;
          } while (uVar5 < uVar3);
        }
        if (uVar3 < 2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
        }
        iVar2 = std::__cxx11::string::compare(local_b0._M_dataplus._M_p + 0x20);
        if (iVar2 == 0) {
          std::__cxx11::string::_M_assign
                    ((string *)&(this->super_EngineProfile).super_Engine.config.idName);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_unused._0_8_ != &local_c0) {
          operator_delete(local_d0._M_unused._M_object);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b0);
    }
  }
  return;
}

Assistant:

void UciEngine::parseLine(int cmdInt, const std::string& cmdString, const std::string& line)
{
    if (cmdInt < 0) return;
    
    auto cmd = static_cast<UciEngineCmd>(cmdInt);
    switch (cmd) {
        case UciEngineCmd::option:
            if (!parseOption(line)) {
                write("Unknown option " + line);
            }
            break;
            
        case UciEngineCmd::info:
            if (computingState == EngineComputingState::thinking) {
                parseInfo(line);
            }
            break;
            
        case UciEngineCmd::bestmove:
        {
            auto timeCtrl = timeController;
            auto moveRecv = moveReceiver;
            if (timeCtrl == nullptr || moveRecv == nullptr) {
                return;
            }
            
            assert(expectingBestmove);
            assert(computingState != EngineComputingState::idle);
            
            expectingBestmove = false;
            auto oldComputingState = computingState;
            computingState = EngineComputingState::idle;
            
            auto period = timeCtrl->moveTimeConsumed(); // moveTimeConsumed();
            
            auto vec = splitString(line, ' ');
            if (vec.size() < 2) {
                return;
            }
            auto moveString = vec.at(1);
            
            std::string ponderMoveString = "";
            if (vec.size() >= 4 && vec.at(2) == "ponder") {
                ponderMoveString = vec.at(3);
            }
            
            if (!moveString.empty() && moveReceiver != nullptr) {
                auto move = board->moveFromCoordiateString(moveString);
                auto ponderMove = board->moveFromCoordiateString(ponderMoveString);
                (moveRecv)(move, moveString, ponderMove, period, oldComputingState);
            }
            
            break;
        }

        case UciEngineCmd::uciok:
        {
            setState(PlayerState::ready);
            expectingBestmove = false;
            sendOptions();
            sendPing();
            break;
        }

        case UciEngineCmd::theId:
        {
            auto vec = splitString(line, ' ');
            if (vec.size() <= 2) {
                return;
            }
            
            std::string str;
            for(size_t i = 2; i < vec.size(); i++) {
                if (!str.empty()) str += " ";
                str += vec.at(i);
            }
            
            if (vec.at(1) == "name") { // name or author
                config.idName = str;
            }
            break;
        }
            
        default:
            break;
    }
}